

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_deadline_timer.hpp
# Opt level: O0

size_t __thiscall
asio::basic_deadline_timer<boost::posix_time::ptime,_asio::time_traits<boost::posix_time::ptime>_>::
expires_at(basic_deadline_timer<boost::posix_time::ptime,_asio::time_traits<boost::posix_time::ptime>_>
           *this,time_type *expiry_time)

{
  service_type *this_00;
  implementation_type *impl;
  size_t sVar1;
  size_t s;
  error_code ec;
  time_type *expiry_time_local;
  basic_deadline_timer<boost::posix_time::ptime,_asio::time_traits<boost::posix_time::ptime>_>
  *this_local;
  
  ec._M_cat = (error_category *)expiry_time;
  std::error_code::error_code((error_code *)&s);
  this_00 = basic_io_object<asio::detail::deadline_timer_service<asio::time_traits<boost::posix_time::ptime>_>,_true>
            ::get_service(&this->
                           super_basic_io_object<asio::detail::deadline_timer_service<asio::time_traits<boost::posix_time::ptime>_>,_true>
                         );
  impl = basic_io_object<asio::detail::deadline_timer_service<asio::time_traits<boost::posix_time::ptime>_>,_true>
         ::get_implementation
                   (&this->
                     super_basic_io_object<asio::detail::deadline_timer_service<asio::time_traits<boost::posix_time::ptime>_>,_true>
                   );
  sVar1 = detail::deadline_timer_service<asio::time_traits<boost::posix_time::ptime>_>::expires_at
                    (this_00,impl,(time_type *)ec._M_cat,(error_code *)&s);
  detail::throw_error((error_code *)&s,"expires_at");
  return sVar1;
}

Assistant:

std::size_t expires_at(const time_type& expiry_time)
  {
    asio::error_code ec;
    std::size_t s = this->get_service().expires_at(
        this->get_implementation(), expiry_time, ec);
    asio::detail::throw_error(ec, "expires_at");
    return s;
  }